

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,V lt,size_t rt)

{
  Bucket *rt_00;
  Relations RVar1;
  
  rt_00 = RelationsGraph<dg::vr::ValueRelations>::getBorderB(&this->graph,rt);
  if (rt_00 != (Bucket *)0x0) {
    RVar1 = _between(this,lt,rt_00);
    return (Relations)RVar1.bits.super__Base_bitset<1UL>._M_w;
  }
  return (Relations)0;
}

Assistant:

Relations ValueRelations::_between(V lt, size_t rt) const {
    HandlePtr mH = getBorderH(rt);
    return mH ? _between(lt, *mH) : Relations();
}